

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoryDecoder.h
# Opt level: O2

FixedDatum *
KDIS::DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::FixedDatum>::FactoryDecode
          (KINT32 EnumVal,KDataStream *stream)

{
  iterator iVar1;
  FixedDatum *pFVar2;
  KINT32 local_c;
  
  local_c = EnumVal;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::FixedDatum>_>_>,_std::_Select1st<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::FixedDatum>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::FixedDatum>_>_>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::FixedDatum>_>_>,_std::_Select1st<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::FixedDatum>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::FixedDatum>_>_>_>_>
                  *)m_mDecoders,&local_c);
  if (iVar1._M_node == (_Base_ptr)(m_mDecoders + 8)) {
    pFVar2 = (FixedDatum *)0x0;
  }
  else {
    pFVar2 = (FixedDatum *)
             (**(code **)(*(long *)iVar1._M_node[1]._M_left + 0x10))
                       (iVar1._M_node[1]._M_left,local_c,stream);
  }
  return pFVar2;
}

Assistant:

static DecoderBaseTyp *FactoryDecode(KINT32 EnumVal, KDataStream &stream) noexcept(false)
	{
		// Try to find a decoder
		typename std::map<KINT32, FacDecPtr>::iterator itr = m_mDecoders.find( EnumVal );
		if( itr != m_mDecoders.end() )
		{
			return itr->second->FactoryDecode( EnumVal, stream );
		}
		
		// No decoders found so return NULL.
		return 0;
	}